

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O0

Rwr_Node_t *
Rwr_ManTryNode(Rwr_Man_t *p,Rwr_Node_t *p0,Rwr_Node_t *p1,int fExor,int Level,int Volume)

{
  int iVar1;
  Rwr_Node_t *pRVar2;
  uint local_60;
  uint local_58;
  uint local_54;
  Rwr_Node_t **ppRStack_50;
  uint uTruth;
  Rwr_Node_t **ppPlace;
  Rwr_Node_t *pNew;
  Rwr_Node_t *pOld;
  int Volume_local;
  int Level_local;
  int fExor_local;
  Rwr_Node_t *p1_local;
  Rwr_Node_t *p0_local;
  Rwr_Man_t *p_local;
  
  p->nConsidered = p->nConsidered + 1;
  if (fExor == 0) {
    iVar1 = Rwr_IsComplement(p0);
    if (iVar1 == 0) {
      pRVar2 = Rwr_Regular(p0);
      local_58 = *(uint *)&pRVar2->field_0xe & 0xffff;
    }
    else {
      pRVar2 = Rwr_Regular(p0);
      local_58 = *(uint *)&pRVar2->field_0xe & 0xffff ^ 0xffffffff;
    }
    iVar1 = Rwr_IsComplement(p1);
    if (iVar1 == 0) {
      pRVar2 = Rwr_Regular(p1);
      local_60 = *(uint *)&pRVar2->field_0xe & 0xffff;
    }
    else {
      pRVar2 = Rwr_Regular(p1);
      local_60 = *(uint *)&pRVar2->field_0xe & 0xffff ^ 0xffffffff;
    }
    local_54 = local_58 & local_60 & 0xffff;
  }
  else {
    local_54 = *(uint *)&p0->field_0xe & 0xffff ^ *(uint *)&p1->field_0xe & 0xffff;
  }
  if ((Level < 3) || (p->pPractical[p->puCanons[local_54]] != '\0')) {
    ppRStack_50 = p->pTable + local_54;
    for (pNew = *ppRStack_50; pNew != (Rwr_Node_t *)0x0; pNew = pNew->pNext) {
      if (((*(uint *)&pNew->field_0xe >> 0x18 & 0x3f) < (uint)Level) &&
         ((*(uint *)&pNew->field_0xe >> 0x10 & 0xff) < (uint)Volume)) {
        return (Rwr_Node_t *)0x0;
      }
      if (((*(uint *)&pNew->field_0xe >> 0x18 & 0x3f) == Level) &&
         ((*(uint *)&pNew->field_0xe >> 0x10 & 0xff) < (uint)Volume)) {
        return (Rwr_Node_t *)0x0;
      }
      ppRStack_50 = &pNew->pNext;
    }
    if ((p->pTable[local_54] == (Rwr_Node_t *)0x0) && (p->puCanons[local_54] == local_54)) {
      p->nClasses = p->nClasses + 1;
    }
    p_local = (Rwr_Man_t *)Extra_MmFixedEntryFetch(p->pMmNode);
    p_local->nFuncs = p->vForest->nSize;
    *(int *)&p_local->field_0x4 = 0;
    *(uint *)((long)&p_local->puCanons + 6) =
         *(uint *)((long)&p_local->puCanons + 6) & 0xffff0000 | local_54;
    *(uint *)((long)&p_local->puCanons + 6) =
         *(uint *)((long)&p_local->puCanons + 6) & 0xc0ffffff | (Level & 0x3fU) << 0x18;
    *(uint *)((long)&p_local->puCanons + 6) =
         *(uint *)((long)&p_local->puCanons + 6) & 0xff00ffff | (Volume & 0xffU) << 0x10;
    *(uint *)((long)&p_local->puCanons + 6) = *(uint *)((long)&p_local->puCanons + 6) & 0xbfffffff;
    *(uint *)((long)&p_local->puCanons + 6) =
         *(uint *)((long)&p_local->puCanons + 6) & 0x7fffffff | fExor << 0x1f;
    p_local->pPerms = (char *)p0;
    p_local->pMap = (uchar *)p1;
    p_local->pMapInv = (unsigned_short *)0x0;
    Vec_PtrPush(p->vForest,p_local);
    *ppRStack_50 = (Rwr_Node_t *)p_local;
  }
  else {
    p_local = (Rwr_Man_t *)0x0;
  }
  return (Rwr_Node_t *)p_local;
}

Assistant:

Rwr_Node_t * Rwr_ManTryNode( Rwr_Man_t * p, Rwr_Node_t * p0, Rwr_Node_t * p1, int fExor, int Level, int Volume )
{
    Rwr_Node_t * pOld, * pNew, ** ppPlace;
    unsigned uTruth;
    // compute truth table, level, volume
    p->nConsidered++;
    if ( fExor )
    {
//        printf( "Considering EXOR of %d and %d.\n", p0->Id, p1->Id );
        uTruth = (p0->uTruth ^ p1->uTruth);
    }
    else
        uTruth = (Rwr_IsComplement(p0)? ~Rwr_Regular(p0)->uTruth : Rwr_Regular(p0)->uTruth) & 
                 (Rwr_IsComplement(p1)? ~Rwr_Regular(p1)->uTruth : Rwr_Regular(p1)->uTruth) & 0xFFFF;
    // skip non-practical classes
    if ( Level > 2 && !p->pPractical[p->puCanons[uTruth]] )
        return NULL;
    // enumerate through the nodes with the same canonical form
    ppPlace = p->pTable + uTruth;
    for ( pOld = *ppPlace; pOld; ppPlace = &pOld->pNext, pOld = pOld->pNext )
    {
        if ( pOld->Level <  (unsigned)Level && pOld->Volume < (unsigned)Volume )
            return NULL;
        if ( pOld->Level == (unsigned)Level && pOld->Volume < (unsigned)Volume )
            return NULL;
//        if ( pOld->Level <  (unsigned)Level && pOld->Volume == (unsigned)Volume )
//            return NULL;
    }
/*
    // enumerate through the nodes with the opposite polarity
    for ( pOld = p->pTable[~uTruth & 0xFFFF]; pOld; pOld = pOld->pNext )
    {
        if ( pOld->Level <  (unsigned)Level && pOld->Volume < (unsigned)Volume )
            return NULL;
        if ( pOld->Level == (unsigned)Level && pOld->Volume < (unsigned)Volume )
            return NULL;
//        if ( pOld->Level <  (unsigned)Level && pOld->Volume == (unsigned)Volume )
//            return NULL;
    }
*/
    // count the classes
    if ( p->pTable[uTruth] == NULL && p->puCanons[uTruth] == uTruth )
        p->nClasses++;
    // create the new node
    pNew = (Rwr_Node_t *)Extra_MmFixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = Level;
    pNew->Volume = Volume;
    pNew->fUsed  = 0;
    pNew->fExor  = fExor;
    pNew->p0     = p0;
    pNew->p1     = p1;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    *ppPlace     = pNew;
    return pNew;
}